

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

shared_ptr<mocker::ir::IRInst>
mocker::replaceTerminatorLabel(shared_ptr<mocker::ir::IRInst> *inst,size_t oldLabel,size_t newLabel)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  uint __line;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *__assertion;
  shared_ptr<mocker::ir::IRInst> sVar4;
  shared_ptr<mocker::ir::Label> local_60;
  shared_ptr<mocker::ir::Jump> p;
  size_t newLabel_local;
  shared_ptr<mocker::ir::Addr> local_38;
  
  ir::dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)oldLabel);
  if (p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)oldLabel);
    if (p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      __assertion = "false";
      __line = 0x69;
    }
    else {
      p_Var1 = p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
               super_IRInst._vptr_IRInst[1];
      p_Var2 = p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
               super_Terminator._vptr_Terminator[1];
      if (p_Var1 != p_Var2) {
        if (p_Var1 == (_func_int *)newLabel) {
          std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_60);
          std::
          make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>const&>
                    (&local_38,
                     &(p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      label,&local_60);
        }
        else {
          if (p_Var2 != (_func_int *)newLabel) {
            __assertion = "false";
            __line = 0x67;
            goto LAB_0015dbe6;
          }
          std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_60);
          std::
          make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>>
                    (&local_38,
                     &(p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      label,(shared_ptr<mocker::ir::Label> *)
                            (p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 1));
        }
LAB_0015db3d:
        _Var3._M_pi = local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)
             local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
             = _Var3._M_pi;
        local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        sVar4.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar4.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)inst;
        return (shared_ptr<mocker::ir::IRInst>)
               sVar4.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
      }
      __assertion = "p->getThen()->getID() != p->getElse()->getID()";
      __line = 0x5e;
    }
  }
  else {
    if ((((p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->label).
         super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id == newLabel)
    {
      std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_60);
      std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                ((shared_ptr<mocker::ir::Label> *)&local_38);
      goto LAB_0015db3d;
    }
    __assertion = "p->getLabel()->getID() == oldLabel";
    __line = 0x5a;
  }
LAB_0015dbe6:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                ,__line,
                "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
               );
}

Assistant:

std::shared_ptr<ir::IRInst>
replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &inst,
                       std::size_t oldLabel, std::size_t newLabel) {
  if (auto p = ir::dyc<ir::Jump>(inst)) {
    assert(p->getLabel()->getID() == oldLabel);
    return std::make_shared<ir::Jump>(std::make_shared<ir::Label>(newLabel));
  }
  if (auto p = ir::dyc<ir::Branch>(inst)) {
    assert(p->getThen()->getID() != p->getElse()->getID());
    if (p->getThen()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(p->getCondition(),
                                          std::make_shared<ir::Label>(newLabel),
                                          p->getElse());
    if (p->getElse()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(
          p->getCondition(), p->getThen(),
          std::make_shared<ir::Label>(newLabel));
    assert(false);
  }
  assert(false);
}